

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TreeFinishNode(SegmentNode *pTree,int iHeight,sqlite3_int64 iLeftChild)

{
  int iVar1;
  
  iVar1 = sqlite3Fts3VarintLen(iLeftChild);
  pTree->aData[10 - (long)iVar1] = (char)iHeight;
  sqlite3Fts3PutVarint(pTree->aData + (0xb - iVar1),iLeftChild);
  return 10 - iVar1;
}

Assistant:

static int fts3TreeFinishNode(
  SegmentNode *pTree, 
  int iHeight, 
  sqlite3_int64 iLeftChild
){
  int nStart;
  assert( iHeight>=1 && iHeight<128 );
  nStart = FTS3_VARINT_MAX - sqlite3Fts3VarintLen(iLeftChild);
  pTree->aData[nStart] = (char)iHeight;
  sqlite3Fts3PutVarint(&pTree->aData[nStart+1], iLeftChild);
  return nStart;
}